

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

int amqp_decode_bytes(amqp_bytes_t encoded,size_t *offset,amqp_bytes_t *output,size_t len)

{
  size_t offset_00;
  ulong uVar1;
  void *pvVar2;
  long *in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  ulong in_RDI;
  long in_R8;
  size_t o;
  uint local_4;
  
  offset_00 = *in_RDX;
  uVar1 = offset_00 + in_R8;
  *in_RDX = uVar1;
  if (uVar1 <= in_RDI) {
    pvVar2 = amqp_offset(in_RSI,offset_00);
    in_RCX[1] = (long)pvVar2;
    *in_RCX = in_R8;
  }
  local_4 = (uint)(uVar1 <= in_RDI);
  return local_4;
}

Assistant:

static inline int amqp_decode_bytes(amqp_bytes_t encoded, size_t *offset,
                                    amqp_bytes_t *output, size_t len) {
  size_t o = *offset;
  if ((*offset = o + len) <= encoded.len) {
    output->bytes = amqp_offset(encoded.bytes, o);
    output->len = len;
    return 1;
  } else {
    return 0;
  }
}